

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,string *t_why)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,"Error: \"",t_why);
  std::operator+(&local_30,&local_50,"\" ");
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__eval_error_0045e038;
  std::__cxx11::string::string((string *)&this->reason,t_why);
  (this->start_position).line = 0;
  (this->start_position).column = 0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  (this->detail)._M_string_length = 0;
  (this->detail).field_2._M_local_buf[0] = '\0';
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit eval_error(const std::string &t_why) noexcept
          : std::runtime_error("Error: \"" + t_why + "\" ")
          , reason(t_why) {
      }